

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QPagedPaintDevice::PdfVersion,_QPdfEngine::PdfVersion>_>::
rehash(Data<QHashPrivate::Node<QPagedPaintDevice::PdfVersion,_QPdfEngine::PdfVersion>_> *this,
      size_t sizeHint)

{
  Node<QPagedPaintDevice::PdfVersion,_QPdfEngine::PdfVersion> *key;
  uchar *puVar1;
  ulong uVar2;
  Span *pSVar3;
  Node<QPagedPaintDevice::PdfVersion,_QPdfEngine::PdfVersion> *pNVar4;
  ulong uVar5;
  ulong uVar6;
  Span *pSVar7;
  size_t index;
  size_t numBuckets;
  long lVar8;
  long lVar9;
  long in_FS_OFFSET;
  R RVar10;
  Bucket local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (sizeHint == 0) {
    sizeHint = this->size;
  }
  numBuckets = 0x80;
  if ((0x40 < sizeHint) && (numBuckets = 0xffffffffffffffff, sizeHint >> 0x3e == 0)) {
    lVar8 = 0x3f;
    if (sizeHint != 0) {
      for (; sizeHint >> lVar8 == 0; lVar8 = lVar8 + -1) {
      }
    }
    numBuckets = 1L << (0x41 - ((byte)lVar8 ^ 0x3f) & 0x3f);
  }
  uVar2 = this->numBuckets;
  pSVar3 = this->spans;
  RVar10 = allocateSpans(numBuckets);
  this->spans = (Span *)RVar10.spans;
  this->numBuckets = numBuckets;
  if (0x7f < uVar2) {
    uVar5 = 0;
    pSVar7 = pSVar3;
    do {
      lVar8 = 0;
      do {
        if ((ulong)pSVar7->offsets[lVar8] != 0xff) {
          key = (Node<QPagedPaintDevice::PdfVersion,_QPdfEngine::PdfVersion> *)
                (pSVar3[uVar5].entries + pSVar7->offsets[lVar8]);
          local_48.index = 0xaaaaaaaaaaaaaaaa;
          local_48.span = (Span *)0xaaaaaaaaaaaaaaaa;
          uVar6 = (this->seed >> 0x20 ^ this->seed ^ (ulong)key->key) * -0x2917014799a6026d;
          uVar6 = (uVar6 >> 0x20 ^ uVar6) * -0x2917014799a6026d;
          local_48 = findBucketWithHash<QPagedPaintDevice::PdfVersion>
                               (this,(PdfVersion *)key,uVar6 >> 0x20 ^ uVar6);
          pNVar4 = Bucket::insert(&local_48);
          *pNVar4 = *key;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x80);
      if (pSVar3[uVar5].entries != (Entry *)0x0) {
        operator_delete__(pSVar3[uVar5].entries);
        pSVar3[uVar5].entries = (Entry *)0x0;
      }
      uVar5 = uVar5 + 1;
      pSVar7 = pSVar7 + 1;
    } while (uVar5 != uVar2 >> 7);
  }
  if (pSVar3 != (Span *)0x0) {
    lVar8 = *(long *)&pSVar3[-1].allocated;
    if (lVar8 != 0) {
      lVar9 = lVar8 * 0x90;
      do {
        if (*(void **)(pSVar3->offsets + lVar9 + -0x10) != (void *)0x0) {
          operator_delete__(*(void **)(pSVar3->offsets + lVar9 + -0x10));
          puVar1 = pSVar3->offsets + lVar9 + -0x10;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
        }
        lVar9 = lVar9 + -0x90;
      } while (lVar9 != 0);
    }
    operator_delete__(&pSVar3[-1].allocated,lVar8 * 0x90 + 8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }